

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O1

ArgSlot __thiscall Wasm::WasmSignature::GetParamSize(WasmSignature *this,ArgSlot index)

{
  ArgSlot AVar1;
  Local LVar2;
  WasmCompilationException *this_00;
  
  LVar2 = GetParam(this,index);
  AVar1 = 8;
  if (3 < LVar2 - FirstLocalType) {
    if (LVar2 != V128) {
      WasmTypes::
      CompileAssertCasesNoFailFast<(Wasm::WasmTypes::WasmType)1,(Wasm::WasmTypes::WasmType)2,(Wasm::WasmTypes::WasmType)3,(Wasm::WasmTypes::WasmType)4,(Wasm::WasmTypes::WasmType)5>
                ();
      this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException(this_00,L"Invalid param type");
      __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
    Simd::EnsureSimdIsEnabled();
    AVar1 = 0x10;
  }
  return AVar1;
}

Assistant:

Js::ArgSlot WasmSignature::GetParamSize(Js::ArgSlot index) const
{
    switch (GetParam(index))
    {
    case WasmTypes::F32:
    case WasmTypes::I32:
        CompileAssert(sizeof(float) == sizeof(int32));
#ifdef _M_X64
        // on x64, we always alloc (at least) 8 bytes per arguments
        return sizeof(void*);
#elif _M_IX86
        return sizeof(int32);
#else
        Assert(UNREACHED);
#endif
        break;
    case WasmTypes::F64:
    case WasmTypes::I64:
        CompileAssert(sizeof(double) == sizeof(int64));
        return sizeof(int64);
        break;
#ifdef ENABLE_WASM_SIMD
    case WasmTypes::V128:
        Wasm::Simd::EnsureSimdIsEnabled();
        CompileAssert(sizeof(Simd::simdvec) == 16);
        return sizeof(Simd::simdvec);
        break;
#endif
    default:
        WasmTypes::CompileAssertCasesNoFailFast<WasmTypes::I32, WasmTypes::I64, WasmTypes::F32, WasmTypes::F64, WASM_V128_CHECK_TYPE>();
        throw WasmCompilationException(_u("Invalid param type"));
    }
}